

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environmental_Process_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Environmental_Process_PDU::Decode
          (Environmental_Process_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  int iVar2;
  undefined7 in_register_00000011;
  ushort uVar3;
  KUINT32 ui32RecType;
  KString local_50;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar2 = 0;
  }
  if (0x1f < iVar2 + (uint)KVar1) {
    std::
    vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
    ::clear(&this->m_vEnvRecords);
    Header7::Decode(&this->super_Header,stream,ignoreHeader);
    (*(this->m_EnvProcID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_EnvProcID,stream);
    (*(this->m_EnvType).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_EnvType,stream);
    KDataStream::Read(stream,&this->m_ui8ModelType);
    KDataStream::Read(stream,&(this->field_3).m_ui8EnvStatus);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumEnvRec);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16SeqNum);
    for (uVar3 = 0; uVar3 < this->m_ui16NumEnvRec; uVar3 = uVar3 + 1) {
      KVar1 = KDataStream::GetCurrentWritePosition(stream);
      KDataStream::Read<unsigned_int>(stream,&ui32RecType);
      KDataStream::SetCurrentWritePosition(stream,KVar1);
      DATA_TYPE::EnvironmentRecord::FactoryDecodeEnvironmentRecord
                ((EnvironmentRecordPtr *)&local_50,stream);
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>>>
      ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>>
                ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>>>
                  *)&this->m_vEnvRecords,(KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord> *)&local_50);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::~KRef_Ptr
                ((KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord> *)&local_50);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Decode",(allocator<char> *)&ui32RecType);
  KException::KException(this_00,&local_50,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Environmental_Process_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < ENVIROMENTAL_PROCESS_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vEnvRecords.clear();

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_EnvProcID
           >> KDIS_STREAM m_EnvType
           >> m_ui8ModelType
           >> m_ui8EnvStatus
           >> m_ui16NumEnvRec
           >> m_ui16SeqNum;

    for( KUINT16 i = 0; i < m_ui16NumEnvRec; ++i )
    {
        // We now need to "peak" at the next 4 bytes to determine the Environment Record type,
        // once we have determined the type we need to return the buffers write positon as this
        // field needs to be re-read by the decode function of the derived Environment Record.
        KUINT16 ui16CurrentWritePos = stream.GetCurrentWritePosition();

        KUINT32 ui32RecType;
        stream >> ui32RecType;

        // We now know what type of record we should create, we need to reset the buffer so this value can be re-read.
        stream.SetCurrentWritePosition( ui16CurrentWritePos );

        m_vEnvRecords.push_back( EnvironmentRecord::FactoryDecodeEnvironmentRecord( stream ) );
    }
}